

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes,
          vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texScales,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texBiases,
          vector<int,_std::allocator<int>_> *num2dArrayLayers)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  const_reference pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_8c8;
  Matrix<float,_4,_4> local_820;
  Vector<tcu::Vector<float,_2>,_3> local_7e0;
  Matrix<float,_4,_4> local_7c8;
  Matrix<float,_4,_4> local_788;
  Matrix<float,_4,_4> local_748;
  Matrix<float,_4,_4> local_708;
  undefined1 auStack_6c8 [8];
  float zScaleTransfData [16];
  undefined1 local_680 [4];
  float numLayers;
  Mat4 transformation_1;
  float sign;
  int i_1;
  float transData [16];
  undefined1 local_5dc [8];
  Mat4 planarTrans4x4;
  Matrix<float,_3,_3> local_578;
  undefined1 local_554 [8];
  Mat4 finalTrans;
  Mat3 planarTrans;
  int faceNdx;
  int i;
  float planarTransData [9];
  Vector<tcu::Vector<float,_2>,_3> local_4b8;
  Matrix<float,_3,_3> local_4a0;
  Matrix<float,_3,_3> local_47c;
  Matrix<float,_3,_3> local_458;
  Matrix<float,_3,_3> local_434;
  Matrix<float,_3,_3> local_410;
  Matrix<float,_3,_3> local_3ec;
  Matrix<float,_3,_3> local_3c8;
  Matrix<float,_3,_3> local_3a4;
  Matrix<float,_3,_3> local_380;
  Matrix<float,_3,_3> local_35c;
  Matrix<float,_3,_3> local_338;
  Matrix<float,_3,_3> local_314;
  Matrix<float,_3,_3> local_2f0;
  Matrix<float,_3,_3> local_2cc;
  undefined1 local_2a8 [8];
  Mat4 transformation;
  float translationTransfData [9];
  float local_238 [2];
  float yShearTransfData [9];
  float local_208;
  float local_204;
  float xShearTransfData [9];
  float local_1d8 [2];
  float scaleTransfData [9];
  float local_1a8;
  float local_1a4;
  float rotTransfData [9];
  float yTranslationAmount;
  float xTranslationAmount;
  float yShearAmount;
  float xShearAmount;
  float yScaleFactor;
  float xScaleFactor;
  float rotAngle;
  int unitNdx;
  int tex2dArrayNdx;
  Random rnd;
  ShaderProgramDeclaration local_140;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_30;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *texScales_local;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *samplerTypes_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes_local;
  int numUnits_local;
  deUint32 randSeed_local;
  MultiTexShader *this_local;
  
  local_30 = texScales;
  texScales_local =
       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)samplerTypes;
  samplerTypes_local = (vector<glu::DataType,_std::allocator<glu::DataType>_> *)unitTypes;
  unitTypes_local._0_4_ = numUnits;
  unitTypes_local._4_4_ = randSeed;
  _numUnits_local = this;
  generateShaderProgramDeclaration(&local_140,numUnits,unitTypes,samplerTypes);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_140);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_03291658;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_03291690;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032916a8;
  *(int *)&(this->super_ShaderProgram).field_0x154 = (int)unitTypes_local;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->m_unitTypes,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)samplerTypes_local);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_texScales,local_30);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_texBiases,texBiases);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_transformations);
  std::
  vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ::vector(&this->m_lodDerivateParts);
  de::Random::Random((Random *)&unitNdx,unitTypes_local._4_4_);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::reserve
            (&this->m_transformations,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::
  vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
  ::reserve(&this->m_lodDerivateParts,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  rotAngle = 0.0;
  for (xScaleFactor = 0.0; (int)xScaleFactor < *(int *)&(this->super_ShaderProgram).field_0x154;
      xScaleFactor = (float)((int)xScaleFactor + 1)) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_unitTypes,(long)(int)xScaleFactor);
    if (*pvVar3 == 0xde1) {
      fVar5 = de::Random::getFloat((Random *)&unitNdx,0.0,6.2831855);
      fVar6 = de::Random::getFloat((Random *)&unitNdx,0.7,1.5);
      fVar7 = de::Random::getFloat((Random *)&unitNdx,0.7,1.5);
      fVar8 = de::Random::getFloat((Random *)&unitNdx,0.0,0.5);
      fVar9 = de::Random::getFloat((Random *)&unitNdx,0.0,0.5);
      de::Random::getFloat((Random *)&unitNdx,-0.5,0.5);
      rotTransfData[8] = de::Random::getFloat((Random *)&unitNdx,-0.5,0.5);
      local_1a8 = ::deFloatCos(fVar5);
      local_1a4 = ::deFloatSin(fVar5);
      local_1a4 = -local_1a4;
      rotTransfData[0] = 0.0;
      rotTransfData[1] = ::deFloatSin(fVar5);
      rotTransfData[2] = ::deFloatCos(fVar5);
      rotTransfData[3] = 0.0;
      rotTransfData[4] = 0.0;
      rotTransfData[5] = 0.0;
      rotTransfData[6] = 1.0;
      local_1d8[1] = 0.0;
      scaleTransfData[0] = 0.0;
      scaleTransfData[1] = 0.0;
      scaleTransfData[3] = 0.0;
      scaleTransfData[4] = 0.0;
      scaleTransfData[5] = 0.0;
      scaleTransfData[6] = 1.0;
      local_208 = 1.0;
      xShearTransfData[0] = 0.0;
      xShearTransfData[1] = 0.0;
      xShearTransfData[2] = 1.0;
      xShearTransfData[3] = 0.0;
      xShearTransfData[4] = 0.0;
      xShearTransfData[5] = 0.0;
      xShearTransfData[6] = 1.0;
      local_238[0] = 1.0;
      local_238[1] = 0.0;
      yShearTransfData[0] = 0.0;
      yShearTransfData[2] = 1.0;
      yShearTransfData[3] = 0.0;
      yShearTransfData[4] = 0.0;
      yShearTransfData[5] = 0.0;
      yShearTransfData[6] = 1.0;
      transformation.m_data.m_data[3].m_data[2] = 1.0;
      transformation.m_data.m_data[3].m_data[3] = 0.0;
      yShearTransfData[1] = fVar9;
      local_204 = fVar8;
      local_1d8[0] = fVar6;
      scaleTransfData[2] = fVar7;
      tcu::Matrix<float,_3,_3>::Matrix(&local_3a4,MultiTexShader::tempOffsetData);
      tcu::Matrix<float,_3,_3>::Matrix(&local_3c8,transformation.m_data.m_data[3].m_data + 2);
      tcu::operator*(&local_380,&local_3a4,&local_3c8);
      tcu::Matrix<float,_3,_3>::Matrix(&local_3ec,&local_1a8);
      tcu::operator*(&local_35c,&local_380,&local_3ec);
      tcu::Matrix<float,_3,_3>::Matrix(&local_410,local_1d8);
      tcu::operator*(&local_338,&local_35c,&local_410);
      tcu::Matrix<float,_3,_3>::Matrix(&local_434,&local_208);
      tcu::operator*(&local_314,&local_338,&local_434);
      tcu::Matrix<float,_3,_3>::Matrix(&local_458,local_238);
      tcu::operator*(&local_2f0,&local_314,&local_458);
      tcu::Matrix<float,_3,_3>::Matrix(&local_4a0,MultiTexShader::tempOffsetData);
      tcu::operator*(&local_47c,&local_4a0,-1.0);
      tcu::operator*(&local_2cc,&local_2f0,&local_47c);
      matExtend3To4((Mat4 *)local_2a8,&local_2cc);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_2cc);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_47c);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_4a0);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_2f0);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_458);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_314);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_434);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_338);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_410);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_35c);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_3ec);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_380);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_3c8);
      tcu::Matrix<float,_3,_3>::~Matrix(&local_3a4);
      calculateLodDerivateParts(&local_4b8,(Mat4 *)local_2a8);
      std::
      vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
      ::push_back(&this->m_lodDerivateParts,&local_4b8);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&this->m_transformations,(value_type *)local_2a8);
      tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_2a8);
    }
    else {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_unitTypes,(long)(int)xScaleFactor);
      if (*pvVar3 == 0x8513) {
        for (planarTrans.m_data.m_data[2].m_data[2] = 0.0;
            (int)planarTrans.m_data.m_data[2].m_data[2] < 9;
            planarTrans.m_data.m_data[2].m_data[2] =
                 (float)((int)planarTrans.m_data.m_data[2].m_data[2] + 1)) {
          if ((planarTrans.m_data.m_data[2].m_data[2] == 0.0) ||
             (planarTrans.m_data.m_data[2].m_data[2] == 5.60519e-45)) {
            fVar5 = de::Random::getFloat((Random *)&unitNdx,0.1,0.9);
            (&faceNdx)[(int)planarTrans.m_data.m_data[2].m_data[2]] = (int)fVar5;
          }
          else if (planarTrans.m_data.m_data[2].m_data[2] == 1.12104e-44) {
            planarTransData[6] = 1.0;
          }
          else {
            (&faceNdx)[(int)planarTrans.m_data.m_data[2].m_data[2]] = 0;
          }
        }
        iVar2 = de::Random::getInt((Random *)&unitNdx,0,5);
        tcu::Matrix<float,_3,_3>::Matrix
                  ((Matrix<float,_3,_3> *)(finalTrans.m_data.m_data[3].m_data + 2),(float *)&faceNdx
                  );
        tcu::Matrix<float,_3,_3>::Matrix
                  ((Matrix<float,_3,_3> *)(planarTrans4x4.m_data.m_data[3].m_data + 2),
                   MultiTexShader::s_cubeTransforms[iVar2]);
        tcu::operator*(&local_578,
                       (Matrix<float,_3,_3> *)(planarTrans4x4.m_data.m_data[3].m_data + 2),
                       (Matrix<float,_3,_3> *)(finalTrans.m_data.m_data[3].m_data + 2));
        matExtend3To4((Mat4 *)local_554,&local_578);
        tcu::Matrix<float,_3,_3>::~Matrix(&local_578);
        tcu::Matrix<float,_3,_3>::~Matrix
                  ((Matrix<float,_3,_3> *)(planarTrans4x4.m_data.m_data[3].m_data + 2));
        matExtend3To4((Mat4 *)local_5dc,(Mat3 *)(finalTrans.m_data.m_data[3].m_data + 2));
        calculateLodDerivateParts
                  ((Vector<tcu::Vector<float,_2>,_3> *)(transData + 0xf),(Mat4 *)local_5dc);
        std::
        vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
        ::push_back(&this->m_lodDerivateParts,(value_type *)(transData + 0xf));
        std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                  (&this->m_transformations,(value_type *)local_554);
        tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_5dc);
        tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_554);
        tcu::Matrix<float,_3,_3>::~Matrix
                  ((Matrix<float,_3,_3> *)(finalTrans.m_data.m_data[3].m_data + 2));
      }
      else {
        for (transformation_1.m_data.m_data[3].m_data[3] = 0.0;
            (int)transformation_1.m_data.m_data[3].m_data[3] < 0x10;
            transformation_1.m_data.m_data[3].m_data[3] =
                 (float)((int)transformation_1.m_data.m_data[3].m_data[3] + 1)) {
          bVar1 = de::Random::getBool((Random *)&unitNdx);
          local_8c8 = 1.0;
          if (!bVar1) {
            local_8c8 = -1.0;
          }
          transformation_1.m_data.m_data[3].m_data[2] = local_8c8;
          fVar5 = de::Random::getFloat((Random *)&unitNdx,0.7,1.4);
          (&sign)[(int)transformation_1.m_data.m_data[3].m_data[3]] =
               fVar5 * transformation_1.m_data.m_data[3].m_data[2];
        }
        tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)local_680,&sign);
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->m_unitTypes,(long)(int)xScaleFactor);
        if (*pvVar3 == 0x8c1a) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (num2dArrayLayers,(long)(int)rotAngle);
          zScaleTransfData[0xf] = (float)*pvVar4;
          _auStack_6c8 = ZEXT416(0x3f800000);
          zScaleTransfData._8_16_ = ZEXT816(0x3f80000000000000);
          zScaleTransfData._24_16_ = ZEXT416((uint)zScaleTransfData[0xf]) << 0x40;
          zScaleTransfData._40_12_ = SUB1612(ZEXT416(0),0);
          zScaleTransfData[0xd] = 1.0;
          tcu::Matrix<float,_4,_4>::Matrix(&local_788,(float *)auStack_6c8);
          tcu::operator*(&local_748,(Matrix<float,_4,_4> *)local_680,&local_788);
          tcu::Matrix<float,_4,_4>::Matrix(&local_7c8,MultiTexShader::zTranslationTransfData);
          tcu::operator*(&local_708,&local_748,&local_7c8);
          tcu::Matrix<float,_4,_4>::operator=((Matrix<float,_4,_4> *)local_680,&local_708);
          tcu::Matrix<float,_4,_4>::~Matrix(&local_708);
          tcu::Matrix<float,_4,_4>::~Matrix(&local_7c8);
          tcu::Matrix<float,_4,_4>::~Matrix(&local_748);
          tcu::Matrix<float,_4,_4>::~Matrix(&local_788);
          rotAngle = (float)((int)rotAngle + 1);
        }
        calculateLodDerivateParts(&local_7e0,(Mat4 *)local_680);
        std::
        vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
        ::push_back(&this->m_lodDerivateParts,&local_7e0);
        tcu::Matrix<float,_4,_4>::Matrix(&local_820,(Matrix<float,_4,_4> *)local_680);
        std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                  (&this->m_transformations,&local_820);
        tcu::Matrix<float,_4,_4>::~Matrix(&local_820);
        tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_680);
      }
    }
  }
  de::Random::~Random((Random *)&unitNdx);
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed,
								int numUnits,
								const vector<GLenum>& unitTypes,
								const vector<glu::DataType>& samplerTypes,
								const vector<Vec4>& texScales,
								const vector<Vec4>& texBiases,
								const vector<int>& num2dArrayLayers)
		: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, unitTypes, samplerTypes))
		, m_numUnits		(numUnits)
		, m_unitTypes		(unitTypes)
		, m_texScales		(texScales)
		, m_texBiases		(texBiases)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	int tex2dArrayNdx = 0; // Keep track of 2d texture array index.

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			static const float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat4 transformation = matExtend3To4(Mat3(tempOffsetData) *
												Mat3(translationTransfData) *
												Mat3(rotTransfData) *
												Mat3(scaleTransfData) *
												Mat3(xShearTransfData) *
												Mat3(yShearTransfData) *
												(Mat3(tempOffsetData) * (-1.0f)));

			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));
			m_transformations.push_back(transformation);
		}
		else if (m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);												// Planar, face-agnostic transformation.
			Mat4	finalTrans		= matExtend3To4(Mat3(s_cubeTransforms[faceNdx]) * planarTrans);	// Final transformation from planar to cube map coordinates, including the transformation just generated.
			Mat4	planarTrans4x4	= matExtend3To4(planarTrans);

			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans4x4));
			m_transformations.push_back(finalTrans);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_3D || m_unitTypes[unitNdx] == GL_TEXTURE_2D_ARRAY);

			float transData[4*4];

			for (int i = 0; i < 4*4; i++)
			{
				float sign = rnd.getBool() ? 1.0f : -1.0f;
				transData[i] = rnd.getFloat(0.7f, 1.4f) * sign;
			}

			Mat4 transformation(transData);

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D_ARRAY)
			{
				// Z direction: Translate by 0.5 and scale by layer amount.

				float numLayers = (float)num2dArrayLayers[tex2dArrayNdx];

				static const float zTranslationTransfData[4*4] =
				{
					1.0f, 0.0f, 0.0f, 0.0f,
					0.0f, 1.0f, 0.0f, 0.0f,
					0.0f, 0.0f, 1.0f, 0.5f,
					0.0f, 0.0f, 0.0f, 1.0f
				};

				float zScaleTransfData[4*4] =
				{
					1.0f,		0.0f,		0.0f,		0.0f,
					0.0f,		1.0f,		0.0f,		0.0f,
					0.0f,		0.0f,		numLayers,	0.0f,
					0.0f,		0.0f,		0.0f,		1.0f
				};

				transformation = transformation * Mat4(zScaleTransfData) * Mat4(zTranslationTransfData);

				tex2dArrayNdx++;
			}

			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));
			m_transformations.push_back(Mat4(transformation));
		}
	}
}